

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O1

string * namingConventions::correctName(string *__return_storage_ptr__,string *name)

{
  char cVar1;
  char cVar2;
  pointer pcVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar3 = (name->_M_dataplus)._M_p;
  uVar8 = 0;
  do {
    uVar7 = uVar8;
    iVar6 = (int)pcVar3[uVar7];
    iVar4 = isalpha(iVar6);
    uVar8 = uVar7 + 1;
  } while (iVar4 == 0);
  iVar4 = isupper(iVar6);
  uVar5 = (ulong)uVar7;
  if (iVar4 != 0) {
    iVar4 = tolower(iVar6);
    pcVar3[uVar7] = (char)iVar4;
  }
  if (uVar5 < name->_M_string_length) {
    do {
      pcVar3 = (name->_M_dataplus)._M_p;
      cVar1 = pcVar3[uVar5];
      iVar6 = (int)cVar1;
      iVar4 = isupper(iVar6);
      uVar9 = (ulong)uVar8;
      if (iVar4 == 0) {
LAB_00106d98:
        if (((cVar1 != '_') || (pcVar3[uVar9] != '_')) &&
           ((iVar4 = isalpha(iVar6), cVar1 == '_' || ((iVar4 != 0 || (iVar6 - 0x30U < 10))))))
        goto LAB_00106ddb;
        std::__cxx11::string::erase((ulong)name,uVar5);
      }
      else {
        cVar2 = pcVar3[uVar9];
        iVar4 = isupper((int)cVar2);
        if (iVar4 == 0) goto LAB_00106d98;
        iVar4 = _tolower((int)cVar2);
        (name->_M_dataplus)._M_p[uVar9] = (char)iVar4;
LAB_00106ddb:
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      uVar8 = uVar8 + 1;
      uVar5 = uVar9;
    } while (uVar9 < name->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string namingConventions::correctName(std::string name) {
    std::string corrected;
    unsigned int c = 0;
    while (!isalpha(name[c])) {
        c++;
    }
    if (isupper(name[c])) {
        name[c] = tolower(name[c]);
    }
    for (; c < name.size(); ++c) {
        if (isupper(name[c]) && isupper(name[c + 1])) {
            name[c + 1] = _tolower(name[c + 1]);
            corrected += name[c];
        } else if (name[c] == '_' && name[c + 1] == '_') {
            name.erase(c, 1);
        } else if (!isalpha(name[c]) && !isdigit(name[c]) && name[c] != '_') {
            name.erase(c, 1);
        } else {
            corrected += name[c];
        }
    }
    return corrected;

}